

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::StrpTimeFun::GetFunctions(void)

{
  scalar_function_t *psVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  long lVar2;
  bind_scalar_function_t *pp_Var3;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var4;
  LogicalType *other;
  scalar_function_t *__x;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType list_type;
  ScalarFunction fun;
  undefined4 in_stack_fffffffffffff864;
  undefined4 in_stack_fffffffffffff86c;
  FunctionNullHandling in_stack_fffffffffffff878;
  allocator_type local_781;
  scalar_function_t local_778;
  scalar_function_t local_758;
  vector<duckdb::ScalarFunction,_true> *local_738;
  _func_int **local_730;
  LogicalType local_728;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_710;
  LogicalType local_6f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6e0;
  LogicalType local_6c8;
  LogicalType local_6b0 [4];
  string local_650;
  ScalarFunction local_630;
  undefined1 local_508 [176];
  _Any_data local_458;
  _Manager_type local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  ScalarFunction local_3e0;
  ScalarFunction local_2b8;
  BaseScalarFunction local_190;
  BaseScalarFunction local_e0;
  
  bVar5 = 0;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"strptime","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&local_630,VARCHAR);
  LogicalType::LIST(&local_6c8,(LogicalType *)&local_630);
  LogicalType::~LogicalType((LogicalType *)&local_630);
  LogicalType::LogicalType((LogicalType *)local_508,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_508 + 0x18),VARCHAR);
  __l._M_len = 2;
  __l._M_array = (iterator)local_508;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6e0,__l,(allocator_type *)local_6b0);
  LogicalType::LogicalType(&local_6f8,TIMESTAMP);
  local_758.super__Function_base._M_functor._8_8_ = 0;
  local_758.super__Function_base._M_functor._M_unused._M_function_pointer =
       StrpTimeFunction::Parse<duckdb::timestamp_t>;
  local_758._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_758.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_6b0 + 3,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_6b0 + 3;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff864;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff86c;
  ScalarFunction::ScalarFunction
            (&local_630,(vector<duckdb::LogicalType,_true> *)&local_6e0,&local_6f8,&local_758,
             StrpTimeFunction::Bind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff878,
             (bind_lambda_function_t)in_RDI);
  LogicalType::~LogicalType(local_6b0 + 3);
  if (local_758.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_758.super__Function_base._M_manager)
              ((_Any_data *)&local_758,(_Any_data *)&local_758,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6e0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_508 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_630.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_e0,&local_630.super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_e0);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3e0,(SimpleFunction *)&local_630);
  local_730 = (_func_int **)&PTR__BaseScalarFunction_02474b40;
  local_3e0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  other = &local_630.super_BaseScalarFunction.return_type;
  LogicalType::LogicalType(&local_3e0.super_BaseScalarFunction.return_type,other);
  local_3e0.super_BaseScalarFunction.stability = local_630.super_BaseScalarFunction.stability;
  local_3e0.super_BaseScalarFunction.null_handling =
       local_630.super_BaseScalarFunction.null_handling;
  local_3e0.super_BaseScalarFunction.errors = local_630.super_BaseScalarFunction.errors;
  local_3e0.super_BaseScalarFunction.collation_handling =
       local_630.super_BaseScalarFunction.collation_handling;
  local_3e0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  psVar1 = &local_3e0.function;
  __x = &local_630.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,__x);
  pp_Var3 = &local_630.bind;
  pp_Var4 = &local_3e0.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_3e0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3e0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_630.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_630.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_630.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_738 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_738->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3e0);
  local_3e0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_3e0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3e0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e0.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3e0.super_BaseScalarFunction);
  LogicalType::LogicalType(local_6b0,VARCHAR);
  LogicalType::LogicalType(local_6b0 + 1,&local_6c8);
  __l_00._M_len = 2;
  __l_00._M_array = local_6b0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_710,__l_00,&local_781);
  LogicalType::LogicalType(&local_728,TIMESTAMP);
  local_778.super__Function_base._M_functor._8_8_ = 0;
  local_778.super__Function_base._M_functor._M_unused._M_function_pointer =
       StrpTimeFunction::Parse<duckdb::timestamp_t>;
  local_778._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_778.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_6b0 + 2,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = local_6b0 + 2;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff864;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff86c;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_508,(vector<duckdb::LogicalType,_true> *)&local_710,&local_728,
             &local_778,StrpTimeFunction::Bind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff878,(bind_lambda_function_t)in_RDI);
  ScalarFunction::operator=(&local_630,(ScalarFunction *)local_508);
  local_508._0_8_ = &PTR__ScalarFunction_024743d0;
  if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
  }
  if (local_448 != (_Manager_type)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_508);
  LogicalType::~LogicalType(local_6b0 + 2);
  if (local_778.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_778.super__Function_base._M_manager)
              ((_Any_data *)&local_778,(_Any_data *)&local_778,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_728);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_710);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_6b0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_190,&local_630.super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_190);
  local_630.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_2b8,(SimpleFunction *)&local_630);
  local_2b8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function = local_730;
  LogicalType::LogicalType(&local_2b8.super_BaseScalarFunction.return_type,other);
  psVar1 = &local_2b8.function;
  local_2b8.super_BaseScalarFunction.stability = local_630.super_BaseScalarFunction.stability;
  local_2b8.super_BaseScalarFunction.null_handling =
       local_630.super_BaseScalarFunction.null_handling;
  local_2b8.super_BaseScalarFunction.errors = local_630.super_BaseScalarFunction.errors;
  local_2b8.super_BaseScalarFunction.collation_handling =
       local_630.super_BaseScalarFunction.collation_handling;
  local_2b8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,__x);
  pp_Var3 = &local_630.bind;
  pp_Var4 = &local_2b8.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_2b8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2b8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_630.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_630.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_630.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_630.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_738->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_2b8);
  local_2b8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_2b8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2b8.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_2b8.super_BaseScalarFunction);
  local_630.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_630.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_630.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_630.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_630.function.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_630.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_6c8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StrpTimeFun::GetFunctions() {
	ScalarFunctionSet strptime("strptime");

	const auto list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::TIMESTAMP,
	                          StrpTimeFunction::Parse<timestamp_t>, StrpTimeFunction::Bind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(fun);
	strptime.AddFunction(fun);

	fun = ScalarFunction({LogicalType::VARCHAR, list_type}, LogicalType::TIMESTAMP,
	                     StrpTimeFunction::Parse<timestamp_t>, StrpTimeFunction::Bind);
	BaseScalarFunction::SetReturnsError(fun);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	strptime.AddFunction(fun);
	return strptime;
}